

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqliteArchive.cpp
# Opt level: O2

void __thiscall
gtar::SqliteArchive::writePtr
          (SqliteArchive *this,string *path,void *contents,size_t byteLength,CompressMode mode,
          bool immediate)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  runtime_error *prVar4;
  ostream *poVar5;
  ulong uVar6;
  size_t iValue;
  size_t chunkidx;
  ulong uVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> rawSizes;
  vector<const_char_*,_std::allocator<const_char_*>_> rawTargets;
  vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_> compressedBytes;
  int local_1e0;
  string local_1d8 [32];
  stringstream result;
  ostream local_1a8 [376];
  
  if (this->m_mode == Read) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Can\'t write to an archive opened for reading");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  rawTargets.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rawTargets.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  rawTargets.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rawSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rawSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  rawSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  compressedBytes.
  super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  compressedBytes.
  super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  compressedBytes.
  super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0 = 1;
  if (mode - FastCompress < 2) {
    uVar3 = 0;
    iValue = 0;
    while( true ) {
      uVar7 = uVar3 >> 1;
      uVar6 = byteLength - uVar7;
      if (byteLength < uVar7 || uVar6 == 0) break;
      if (499999999 < uVar6) {
        uVar6 = 500000000;
      }
      iVar1 = LZ4_compressBound((int)uVar6);
      pcVar2 = (char *)operator_new__((long)iVar1);
      SharedArray<char>::SharedArray((SharedArray<char> *)&result,pcVar2,(long)iVar1);
      std::vector<gtar::SharedArray<char>,std::allocator<gtar::SharedArray<char>>>::
      emplace_back<gtar::SharedArray<char>>
                ((vector<gtar::SharedArray<char>,std::allocator<gtar::SharedArray<char>>> *)
                 &compressedBytes,(SharedArray<char> *)&result);
      SharedArray<char>::~SharedArray((SharedArray<char> *)&result);
      if (compressedBytes.
          super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1].m_shim == (SharedArrayShim<char> *)0x0) {
        _result = (char *)0x0;
      }
      else {
        _result = (compressedBytes.
                   super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].m_shim)->m_target;
      }
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&rawTargets,(char **)&result);
      if (compressedBytes.
          super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1].m_shim == (SharedArrayShim<char> *)0x0) {
        pcVar2 = (char *)0x0;
      }
      else {
        pcVar2 = (compressedBytes.
                  super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].m_shim)->m_target;
      }
      iVar1 = LZ4_compress_default((char *)(uVar7 + (long)contents),pcVar2,(int)uVar6,iVar1);
      _result = (char *)(long)iVar1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&rawSizes,(unsigned_long *)&result);
      iValue = iValue + rawSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1];
      uVar3 = uVar3 + 1000000000;
    }
  }
  else if (mode == SlowCompress) {
    uVar3 = 0;
    iValue = 0;
    while( true ) {
      uVar7 = uVar3 >> 1;
      uVar6 = byteLength - uVar7;
      if (byteLength < uVar7 || uVar6 == 0) break;
      if (499999999 < uVar6) {
        uVar6 = 500000000;
      }
      iVar1 = LZ4_compressBound((int)uVar6);
      pcVar2 = (char *)operator_new__((long)iVar1);
      SharedArray<char>::SharedArray((SharedArray<char> *)&result,pcVar2,(long)iVar1);
      std::vector<gtar::SharedArray<char>,std::allocator<gtar::SharedArray<char>>>::
      emplace_back<gtar::SharedArray<char>>
                ((vector<gtar::SharedArray<char>,std::allocator<gtar::SharedArray<char>>> *)
                 &compressedBytes,(SharedArray<char> *)&result);
      SharedArray<char>::~SharedArray((SharedArray<char> *)&result);
      if (compressedBytes.
          super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1].m_shim == (SharedArrayShim<char> *)0x0) {
        _result = (char *)0x0;
      }
      else {
        _result = (compressedBytes.
                   super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].m_shim)->m_target;
      }
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&rawTargets,(char **)&result);
      if (compressedBytes.
          super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1].m_shim == (SharedArrayShim<char> *)0x0) {
        pcVar2 = (char *)0x0;
      }
      else {
        pcVar2 = (compressedBytes.
                  super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].m_shim)->m_target;
      }
      iVar1 = LZ4_compress_HC((char *)(uVar7 + (long)contents),pcVar2,(int)uVar6,iVar1,0xb);
      _result = (char *)(long)iVar1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&rawSizes,(unsigned_long *)&result);
      iValue = iValue + rawSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1];
      uVar3 = uVar3 + 1000000000;
    }
  }
  else {
    local_1e0 = 0;
    uVar3 = 0;
    while( true ) {
      uVar6 = uVar3 >> 1;
      uVar7 = byteLength - uVar6;
      iValue = byteLength;
      if (byteLength < uVar6 || uVar7 == 0) break;
      _result = (char *)(uVar6 + (long)contents);
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&rawTargets,(char **)&result);
      if (499999999 < uVar7) {
        uVar7 = 500000000;
      }
      _result = (char *)uVar7;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&rawSizes,(unsigned_long *)&result);
      uVar3 = uVar3 + 1000000000;
    }
  }
  sqlite3_bind_text(this->m_insert_filename_stmt,1,(path->_M_dataplus)._M_p,
                    (int)path->_M_string_length,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int64(this->m_insert_filename_stmt,2,byteLength);
  sqlite3_bind_int64(this->m_insert_filename_stmt,3,iValue);
  sqlite3_bind_int(this->m_insert_filename_stmt,4,local_1e0);
  sqlite3_bind_text(this->m_insert_contents_stmt,1,(path->_M_dataplus)._M_p,
                    (int)path->_M_string_length,(_func_void_void_ptr *)0x0);
  if (immediate) {
    iVar1 = 5;
    while (iVar1 == 5) {
      sqlite3_step(this->m_begin_stmt);
      sqlite3_step(this->m_insert_filename_stmt);
      for (uVar3 = 0;
          uVar3 < (ulong)((long)rawTargets.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)rawTargets.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
        sqlite3_bind_blob(this->m_insert_contents_stmt,2,
                          rawTargets.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar3],
                          (int)rawSizes.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar3],
                          (_func_void_void_ptr *)0x0);
        sqlite3_bind_int64(this->m_insert_contents_stmt,3,uVar3);
        iVar1 = sqlite3_step(this->m_insert_contents_stmt);
        if (iVar1 != 0x65) {
          std::__cxx11::stringstream::stringstream((stringstream *)&result);
          std::operator<<(local_1a8,"Couldn\'t insert chunk in sqlite database: ");
          pcVar2 = sqlite3_errstr(iVar1);
          std::operator<<(local_1a8,pcVar2);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar4,local_1d8);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sqlite3_reset(this->m_insert_contents_stmt);
      }
      iVar1 = sqlite3_step(this->m_end_stmt);
    }
  }
  else {
    do {
      iVar1 = sqlite3_step(this->m_insert_filename_stmt);
    } while (iVar1 == 5);
    for (uVar3 = 0;
        uVar3 < (ulong)((long)rawTargets.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)rawTargets.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
      sqlite3_bind_blob(this->m_insert_contents_stmt,2,
                        rawTargets.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar3],
                        (int)rawSizes.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar3],
                        (_func_void_void_ptr *)0x0);
      sqlite3_bind_int64(this->m_insert_contents_stmt,3,uVar3);
      do {
        iVar1 = sqlite3_step(this->m_insert_contents_stmt);
      } while (iVar1 == 5);
      sqlite3_reset(this->m_insert_contents_stmt);
    }
  }
  sqlite3_clear_bindings(this->m_insert_filename_stmt);
  sqlite3_clear_bindings(this->m_insert_contents_stmt);
  sqlite3_reset(this->m_begin_stmt);
  sqlite3_reset(this->m_insert_filename_stmt);
  sqlite3_reset(this->m_insert_contents_stmt);
  sqlite3_reset(this->m_end_stmt);
  if (iVar1 != 0x65) {
    std::__cxx11::stringstream::stringstream((stringstream *)&result);
    poVar5 = std::operator<<(local_1a8,"Error inserting record at ");
    poVar5 = std::operator<<(poVar5,(string *)path);
    std::operator<<(poVar5,": ");
    pcVar2 = sqlite3_errmsg(this->m_connection);
    std::operator<<(local_1a8,pcVar2);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,local_1d8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_fileNames,path);
  std::vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>::~vector
            (&compressedBytes);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&rawSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&rawTargets.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return;
}

Assistant:

void SqliteArchive::writePtr(const string &path, const void *contents,
                                 const size_t byteLength, CompressMode mode,
                                 bool immediate)
    {
        if(m_mode == Read)
            throw runtime_error("Can't write to an archive opened for reading");

        vector<const char*> rawTargets;
        vector<size_t> rawSizes;
        size_t compressedSize(0);
        unsigned int rawCompression(0);
        vector<SharedArray<char> > compressedBytes;

        if(mode == FastCompress || mode == MediumCompress)
        {
            for(size_t chunkidx(0); chunkidx*LZ4_CHUNK_SIZE < byteLength; ++chunkidx)
            {
                const int sourceSize(min((size_t) LZ4_CHUNK_SIZE, byteLength - chunkidx*LZ4_CHUNK_SIZE));
                const int maxSize(LZ4_compressBound(sourceSize));

                compressedBytes.push_back(SharedArray<char>(new char[maxSize], maxSize));
                rawTargets.push_back(compressedBytes.back().get());
                rawSizes.push_back(LZ4_compress_default(
                                       ((const char*) contents) + chunkidx*LZ4_CHUNK_SIZE,
                                       compressedBytes.back().get(), sourceSize,
                                       maxSize));
                compressedSize += rawSizes.back();
            }
            rawCompression = 1;
        }
        else if(mode == SlowCompress)
        {
            for(size_t chunkidx(0); chunkidx*LZ4_CHUNK_SIZE < byteLength; ++chunkidx)
            {
                const int sourceSize(min((size_t) LZ4_CHUNK_SIZE, byteLength - chunkidx*LZ4_CHUNK_SIZE));
                const int maxSize(LZ4_compressBound(sourceSize));

                compressedBytes.push_back(SharedArray<char>(new char[maxSize], maxSize));
                rawTargets.push_back(compressedBytes.back().get());
                rawSizes.push_back(LZ4_compress_HC(
                                       ((const char*) contents) + chunkidx*LZ4_CHUNK_SIZE,
                                       compressedBytes.back().get(), sourceSize,
                                       maxSize, LZ4HC_CLEVEL_OPT_MIN));
                compressedSize += rawSizes.back();
            }
            rawCompression = 1;
        }
        else
        {
            for(size_t chunkidx(0); chunkidx*RAW_CHUNK_SIZE < byteLength; ++chunkidx)
            {
                const int sourceSize(min((size_t) RAW_CHUNK_SIZE, byteLength - chunkidx*RAW_CHUNK_SIZE));
                rawTargets.push_back(((const char*) contents) + chunkidx*RAW_CHUNK_SIZE);
                rawSizes.push_back(sourceSize);
            }
            compressedSize = byteLength;
        }

        sqlite3_bind_text(m_insert_filename_stmt, 1, path.c_str(), path.size(), 0);
        sqlite3_bind_int64(m_insert_filename_stmt, 2, byteLength);
        sqlite3_bind_int64(m_insert_filename_stmt, 3, compressedSize);
        sqlite3_bind_int(m_insert_filename_stmt, 4, rawCompression);

        sqlite3_bind_text(m_insert_contents_stmt, 1, path.c_str(), path.size(), 0);

        int status(SQLITE_BUSY);

        if(immediate)
        {
            while(status == SQLITE_BUSY)
            {
                status = sqlite3_step(m_begin_stmt);

                status = sqlite3_step(m_insert_filename_stmt);

                for(size_t chunkidx(0); chunkidx < rawTargets.size(); ++chunkidx)
                {
                    sqlite3_bind_blob(m_insert_contents_stmt, 2, (const void*) rawTargets[chunkidx],
                                        rawSizes[chunkidx], 0);
                    sqlite3_bind_int64(m_insert_contents_stmt, 3, chunkidx);
                    status = sqlite3_step(m_insert_contents_stmt);

                    if(status != SQLITE_DONE)
                    {
                        stringstream result;
                        result << "Couldn't insert chunk in sqlite database: ";
                        result << sqlite3_errstr(status);
                        throw runtime_error(result.str());
                    }

                    sqlite3_reset(m_insert_contents_stmt);
                }

                status = sqlite3_step(m_end_stmt);
            }
        }
        else
        {
            do {status = sqlite3_step(m_insert_filename_stmt);} while(status == SQLITE_BUSY);

            for(size_t chunkidx(0); chunkidx < rawTargets.size(); ++chunkidx)
            {
                sqlite3_bind_blob(m_insert_contents_stmt, 2, (const void*) rawTargets[chunkidx],
                                    rawSizes[chunkidx], 0);
                sqlite3_bind_int64(m_insert_contents_stmt, 3, chunkidx);
                do {status = sqlite3_step(m_insert_contents_stmt);} while(status == SQLITE_BUSY);
                sqlite3_reset(m_insert_contents_stmt);
            }
        }

        sqlite3_clear_bindings(m_insert_filename_stmt);
        sqlite3_clear_bindings(m_insert_contents_stmt);
        sqlite3_reset(m_begin_stmt);
        sqlite3_reset(m_insert_filename_stmt);
        sqlite3_reset(m_insert_contents_stmt);
        sqlite3_reset(m_end_stmt);

        if(status != SQLITE_DONE)
        {
            stringstream result;
            result << "Error inserting record at " << path << ": ";
            result << sqlite3_errmsg(m_connection);
            throw runtime_error(result.str());
        }

        m_fileNames.push_back(path);
    }